

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O0

void bk_lib::detail::fill<std::pair<unsigned_int,Clasp::ConstString>>
               (pair<unsigned_int,_Clasp::ConstString> *first,
               pair<unsigned_int,_Clasp::ConstString> *last,
               pair<unsigned_int,_Clasp::ConstString> *x)

{
  pair<unsigned_int,_Clasp::ConstString> *this;
  long in_RSI;
  long in_RDI;
  pair<unsigned_int,_Clasp::ConstString> *in_stack_ffffffffffffffd8;
  int local_10;
  long local_8;
  
  local_10 = (int)in_RSI;
  local_8._0_4_ = (int)in_RDI;
  this = (pair<unsigned_int,_Clasp::ConstString> *)(ulong)((uint)(local_10 - (int)local_8) >> 4 & 7)
  ;
  local_8 = in_RDI;
  switch(this) {
  case (pair<unsigned_int,_Clasp::ConstString> *)0x0:
    while (local_8 != in_RSI) {
      local_8 = local_8 + 0x10;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(this,in_stack_ffffffffffffffd8);
switchD_00193626_caseD_7:
      local_8 = local_8 + 0x10;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(this,in_stack_ffffffffffffffd8);
switchD_00193626_caseD_6:
      local_8 = local_8 + 0x10;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(this,in_stack_ffffffffffffffd8);
switchD_00193626_caseD_5:
      local_8 = local_8 + 0x10;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(this,in_stack_ffffffffffffffd8);
switchD_00193626_caseD_4:
      local_8 = local_8 + 0x10;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(this,in_stack_ffffffffffffffd8);
switchD_00193626_caseD_3:
      local_8 = local_8 + 0x10;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(this,in_stack_ffffffffffffffd8);
switchD_00193626_caseD_2:
      local_8 = local_8 + 0x10;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(this,in_stack_ffffffffffffffd8);
switchD_00193626_caseD_1:
      local_8 = local_8 + 0x10;
      std::pair<unsigned_int,_Clasp::ConstString>::pair(this,in_stack_ffffffffffffffd8);
    }
    break;
  case (pair<unsigned_int,_Clasp::ConstString> *)0x1:
    goto switchD_00193626_caseD_1;
  case (pair<unsigned_int,_Clasp::ConstString> *)0x2:
    goto switchD_00193626_caseD_2;
  case (pair<unsigned_int,_Clasp::ConstString> *)0x3:
    goto switchD_00193626_caseD_3;
  case (pair<unsigned_int,_Clasp::ConstString> *)0x4:
    goto switchD_00193626_caseD_4;
  case (pair<unsigned_int,_Clasp::ConstString> *)0x5:
    goto switchD_00193626_caseD_5;
  case (pair<unsigned_int,_Clasp::ConstString> *)0x6:
    goto switchD_00193626_caseD_6;
  case (pair<unsigned_int,_Clasp::ConstString> *)0x7:
    goto switchD_00193626_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}